

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# link.hpp
# Opt level: O2

void __thiscall diy::Link::~Link(Link *this)

{
  (this->super_Factory<diy::Link>)._vptr_Factory = (_func_int **)&PTR_id_abi_cxx11__00143838;
  std::_Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>::~_Vector_base
            (&(this->neighbors_).super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>);
  return;
}

Assistant:

Link&     operator=(Link&&)                   = default;